

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereSphereCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtSphereSphereCollisionAlgorithm::processCollision
          (cbtSphereSphereCollisionAlgorithm *this,cbtCollisionObjectWrapper *col0Wrap,
          cbtCollisionObjectWrapper *col1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  float fVar1;
  float fVar2;
  cbtCollisionShape *pcVar3;
  cbtCollisionShape *pcVar4;
  cbtScalar cVar5;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [56];
  undefined1 auVar8 [64];
  undefined1 auVar6 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar15 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  cbtVector3 cVar16;
  cbtScalar len;
  cbtVector3 normalOnSurfaceB;
  cbtVector3 diff;
  cbtVector3 pos1;
  cbtScalar local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  cbtVector3 local_58;
  cbtVector3 local_48;
  undefined1 local_38 [16];
  
  auVar15 = in_ZMM1._8_56_;
  auVar11 = in_ZMM0._8_56_;
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    pcVar3 = col0Wrap->m_shape;
    pcVar4 = col1Wrap->m_shape;
    cVar16 = ::operator-(&col0Wrap->m_worldTransform->m_origin,&col1Wrap->m_worldTransform->m_origin
                        );
    auVar12._0_8_ = cVar16.m_floats._8_8_;
    auVar12._8_56_ = auVar15;
    auVar8._0_8_ = cVar16.m_floats._0_8_;
    auVar8._8_56_ = auVar11;
    local_58.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar8._0_16_,auVar12._0_16_);
    cVar5 = cbtVector3::length(&local_58);
    fVar1 = *(float *)&pcVar3[1].field_0xc;
    fVar2 = *(float *)&pcVar3->field_0x1c;
    local_78 = ZEXT416((uint)(*(float *)&pcVar4[1].field_0xc * *(float *)&pcVar4->field_0x1c));
    local_7c = cVar5;
    cbtPersistentManifold::clearManifold(this->m_manifoldPtr);
    fVar1 = (float)local_78._0_4_ + fVar1 * fVar2;
    if (cVar5 <= fVar1 + resultOut->m_closestPointDistanceThreshold) {
      auVar13 = ZEXT1264(ZEXT812(0));
      auVar15 = ZEXT456(0);
      auVar11 = (undefined1  [56])0x0;
      auVar6 = SUB6416(ZEXT464(0x3f800000),0);
      local_68 = auVar6;
      if (1.1920929e-07 < cVar5) {
        cVar16 = ::operator/(&local_58,&local_7c);
        auVar13._0_8_ = cVar16.m_floats._8_8_;
        auVar13._8_56_ = auVar15;
        auVar9._0_8_ = cVar16.m_floats._0_8_;
        auVar9._8_56_ = auVar11;
        auVar6 = auVar9._0_16_;
        local_68 = vmovlhps_avx(auVar6,auVar13._0_16_);
      }
      auVar15 = (undefined1  [56])0x0;
      auVar7._0_4_ = (float)local_78._0_4_ * auVar6._0_4_;
      auVar7._4_4_ = (float)local_78._0_4_ * auVar6._4_4_;
      auVar7._8_4_ = (float)local_78._0_4_ * auVar6._8_4_;
      auVar7._12_4_ = (float)local_78._0_4_ * auVar6._12_4_;
      local_48.m_floats =
           (cbtScalar  [4])
           vinsertps_avx(auVar7,ZEXT416((uint)((float)local_78._0_4_ * auVar13._0_4_)),0x28);
      auVar11 = ZEXT856(local_48.m_floats._8_8_);
      cVar16 = ::operator+(&col1Wrap->m_worldTransform->m_origin,&local_48);
      auVar14._0_8_ = cVar16.m_floats._8_8_;
      auVar14._8_56_ = auVar15;
      auVar10._0_8_ = cVar16.m_floats._0_8_;
      auVar10._8_56_ = auVar11;
      local_38 = vmovlhps_avx(auVar10._0_16_,auVar14._0_16_);
      (*(resultOut->super_Result)._vptr_Result[4])((ulong)(uint)(cVar5 - fVar1),resultOut,local_68);
    }
  }
  return;
}

Assistant:

void cbtSphereSphereCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* col0Wrap, const cbtCollisionObjectWrapper* col1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)dispatchInfo;

	if (!m_manifoldPtr)
		return;

	resultOut->setPersistentManifold(m_manifoldPtr);

	cbtSphereShape* sphere0 = (cbtSphereShape*)col0Wrap->getCollisionShape();
	cbtSphereShape* sphere1 = (cbtSphereShape*)col1Wrap->getCollisionShape();

	cbtVector3 diff = col0Wrap->getWorldTransform().getOrigin() - col1Wrap->getWorldTransform().getOrigin();
	cbtScalar len = diff.length();
	cbtScalar radius0 = sphere0->getRadius();
	cbtScalar radius1 = sphere1->getRadius();

#ifdef CLEAR_MANIFOLD
	m_manifoldPtr->clearManifold();  //don't do this, it disables warmstarting
#endif

	///iff distance positive, don't generate a new contact
	if (len > (radius0 + radius1 + resultOut->m_closestPointDistanceThreshold))
	{
#ifndef CLEAR_MANIFOLD
		resultOut->refreshContactPoints();
#endif  //CLEAR_MANIFOLD
		return;
	}
	///distance (negative means penetration)
	cbtScalar dist = len - (radius0 + radius1);

	cbtVector3 normalOnSurfaceB(1, 0, 0);
	if (len > SIMD_EPSILON)
	{
		normalOnSurfaceB = diff / len;
	}

	///point on A (worldspace)
	///cbtVector3 pos0 = col0->getWorldTransform().getOrigin() - radius0 * normalOnSurfaceB;
	///point on B (worldspace)
	cbtVector3 pos1 = col1Wrap->getWorldTransform().getOrigin() + radius1 * normalOnSurfaceB;

	/// report a contact. internally this will be kept persistent, and contact reduction is done

	resultOut->addContactPoint(normalOnSurfaceB, pos1, dist);

#ifndef CLEAR_MANIFOLD
	resultOut->refreshContactPoints();
#endif  //CLEAR_MANIFOLD
}